

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

map2json_tree_t * map2json_findTreeNode(map2json_tree_t *root,char *key)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  map2json_tree_t *obj;
  map2json_tree_t *local_20;
  
  local_20 = *(map2json_tree_t **)(in_RDI + 0x30);
  while( true ) {
    if (local_20 == (map2json_tree_t *)0x0) {
      return (map2json_tree_t *)0x0;
    }
    iVar1 = strcmp(local_20->key,in_RSI);
    if (iVar1 == 0) break;
    local_20 = local_20->next;
  }
  return local_20;
}

Assistant:

static map2json_tree_t *map2json_findTreeNode(map2json_tree_t *root, char *key) {
	DEBUG_TEXT("map2json_findTreeNode([map2json_tree_t *], %s)... ", key);
	map2json_tree_t *obj;

	obj = root->children;
	while ( obj != NULL ) {
		if ( !strcmp(obj->key, key) ) {
			DEBUG_TEXT("map2json_findTreeNode([map2json_tree_t *], %s): key found", key);
			DEBUG_TEXT("map2json_findTreeNode([map2json_tree_t *], %s)... DONE", key);
			return obj;
		}
		obj = obj->next;
	}
	DEBUG_TEXT("map2json_findTreeNode([map2json_tree_t *], %s)... DONE", key);
	return NULL;
}